

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O0

void load_kde_mimelnk(char *filename,char *icondir)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int local_1c44;
  Fl_File_Icon *pFStack_1c40;
  int i;
  Fl_File_Icon *icon;
  char full_iconfilename [2048];
  char *val;
  char mimetype [1024];
  char pattern [1024];
  char iconfilename [2048];
  char tmp [1024];
  FILE *fp;
  char *icondir_local;
  char *filename_local;
  
  val._0_1_ = 0;
  mimetype[0x3f8] = '\0';
  pattern[0x3f8] = '\0';
  __stream = (FILE *)fl_fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    while (pcVar2 = fgets(iconfilename + 0x7f8,0x400,__stream), pcVar2 != (char *)0x0) {
      pcVar2 = get_kde_val(iconfilename + 0x7f8,"Icon");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = get_kde_val(iconfilename + 0x7f8,"MimeType");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = get_kde_val(iconfilename + 0x7f8,"Patterns");
          if (pcVar2 != (char *)0x0) {
            fl_strlcpy(mimetype + 0x3f8,pcVar2,0x400);
          }
        }
        else {
          fl_strlcpy((char *)&val,pcVar2,0x400);
        }
      }
      else {
        fl_strlcpy(pattern + 0x3f8,pcVar2,0x800);
      }
    }
    fclose(__stream);
    if (((mimetype[0x3f8] != '\0') || (iVar1 = strncmp((char *)&val,"inode/",6), iVar1 == 0)) &&
       (pattern[0x3f8] != '\0')) {
      if (pattern[0x3f8] == '/') {
        fl_strlcpy((char *)&icon,pattern + 0x3f8,0x800);
      }
      else {
        iVar1 = access(icondir,0);
        if (iVar1 == 0) {
          for (local_1c44 = 0; local_1c44 < 10; local_1c44 = local_1c44 + 1) {
            snprintf((char *)&icon,0x800,"%s/%s/%s.png",icondir,load_kde_mimelnk::paths[local_1c44],
                     pattern + 0x3f8);
            iVar1 = access((char *)&icon,0);
            if (iVar1 == 0) break;
          }
          if (9 < local_1c44) {
            return;
          }
        }
        else {
          snprintf((char *)&icon,0x800,"%s/%s",iconfilename + 0x7f8,pattern + 0x3f8);
          iVar1 = access((char *)&icon,0);
          if (iVar1 != 0) {
            return;
          }
        }
      }
      iVar1 = strncmp((char *)&val,"inode/",6);
      if (iVar1 == 0) {
        iVar1 = strcmp((char *)((long)&val + 6),"directory");
        if (iVar1 == 0) {
          pFStack_1c40 = (Fl_File_Icon *)operator_new(0x28);
          Fl_File_Icon::Fl_File_Icon(pFStack_1c40,"*",5,0,(short *)0x0);
        }
        else {
          iVar1 = strcmp((char *)((long)&val + 6),"blockdevice");
          if (iVar1 == 0) {
            pFStack_1c40 = (Fl_File_Icon *)operator_new(0x28);
            Fl_File_Icon::Fl_File_Icon(pFStack_1c40,"*",3,0,(short *)0x0);
          }
          else {
            iVar1 = strcmp((char *)((long)&val + 6),"fifo");
            if (iVar1 != 0) {
              return;
            }
            pFStack_1c40 = (Fl_File_Icon *)operator_new(0x28);
            Fl_File_Icon::Fl_File_Icon(pFStack_1c40,"*",2,0,(short *)0x0);
          }
        }
      }
      else {
        pFStack_1c40 = (Fl_File_Icon *)operator_new(0x28);
        pcVar2 = kde_to_fltk_pattern(mimetype + 0x3f8);
        Fl_File_Icon::Fl_File_Icon(pFStack_1c40,pcVar2,1,0,(short *)0x0);
      }
      Fl_File_Icon::load(pFStack_1c40,(char *)&icon);
    }
  }
  return;
}

Assistant:

static void
load_kde_mimelnk(const char *filename,	// I - mimelnk filename
                 const char *icondir) {	// I - Location of icons
  FILE		*fp;
  char		tmp[1024];
  char		iconfilename[FL_PATH_MAX];
  char		pattern[1024];
  char		mimetype[1024];
  char		*val;
  char		full_iconfilename[FL_PATH_MAX];
  Fl_File_Icon	*icon;


  mimetype[0]     = '\0';
  pattern[0]      = '\0';
  iconfilename[0] = '\0';

  if ((fp = fl_fopen(filename, "rb")) != NULL) {
    while (fgets(tmp, sizeof(tmp), fp)) {
      if ((val = get_kde_val(tmp, "Icon")) != NULL)
	strlcpy(iconfilename, val, sizeof(iconfilename));
      else if ((val = get_kde_val(tmp, "MimeType")) != NULL)
	strlcpy(mimetype, val, sizeof(mimetype));
      else if ((val = get_kde_val(tmp, "Patterns")) != NULL)
	strlcpy(pattern, val, sizeof(pattern));
    }

    fclose(fp);

#ifdef DEBUG
    printf("%s: Icon=\"%s\", MimeType=\"%s\", Patterns=\"%s\"\n", filename,
           iconfilename, mimetype, pattern);
#endif // DEBUG

    if (!pattern[0] && strncmp(mimetype, "inode/", 6)) return;

    if (iconfilename[0]) {
      if (iconfilename[0] == '/') {
        strlcpy(full_iconfilename, iconfilename, sizeof(full_iconfilename));
      } else if (!access(icondir, F_OK)) {
        // KDE 3.x and 2.x icons
	int		i;		// Looping var
	static const char *paths[] = {	// Subdirs to look in...
	  "16x16/actions",
	  "16x16/apps",
	  "16x16/devices",
	  "16x16/filesystems",
	  "16x16/mimetypes",
/*
	  "20x20/actions",
	  "20x20/apps",
	  "20x20/devices",
	  "20x20/filesystems",
	  "20x20/mimetypes",

	  "22x22/actions",
	  "22x22/apps",
	  "22x22/devices",
	  "22x22/filesystems",
	  "22x22/mimetypes",

	  "24x24/actions",
	  "24x24/apps",
	  "24x24/devices",
	  "24x24/filesystems",
	  "24x24/mimetypes",
*/
	  "32x32/actions",
	  "32x32/apps",
	  "32x32/devices",
	  "32x32/filesystems",
	  "32x32/mimetypes",
/*
	  "36x36/actions",
	  "36x36/apps",
	  "36x36/devices",
	  "36x36/filesystems",
	  "36x36/mimetypes",

	  "48x48/actions",
	  "48x48/apps",
	  "48x48/devices",
	  "48x48/filesystems",
	  "48x48/mimetypes",

	  "64x64/actions",
	  "64x64/apps",
	  "64x64/devices",
	  "64x64/filesystems",
	  "64x64/mimetypes",

	  "96x96/actions",
	  "96x96/apps",
	  "96x96/devices",
	  "96x96/filesystems",
	  "96x96/mimetypes"
*/	};

        for (i = 0; i < (int)(sizeof(paths) / sizeof(paths[0])); i ++) {
          snprintf(full_iconfilename, sizeof(full_iconfilename),
	           "%s/%s/%s.png", icondir, paths[i], iconfilename);

          if (!access(full_iconfilename, F_OK)) break;
	}

        if (i >= (int)(sizeof(paths) / sizeof(paths[0]))) return;
      } else {
        // KDE 1.x icons
        snprintf(full_iconfilename, sizeof(full_iconfilename),
	         "%s/%s", tmp, iconfilename);

        if (access(full_iconfilename, F_OK)) return;
      }

      if (strncmp(mimetype, "inode/", 6) == 0) {
	if (!strcmp(mimetype + 6, "directory"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::DIRECTORY);
	else if (!strcmp(mimetype + 6, "blockdevice"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::DEVICE);
	else if (!strcmp(mimetype + 6, "fifo"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::FIFO);
	else return;
      } else {
        icon = new Fl_File_Icon(kde_to_fltk_pattern(pattern),
                                Fl_File_Icon::PLAIN);
      }

      icon->load(full_iconfilename);
    }
  }
}